

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O0

double __thiscall Curve::getYofX(Curve *this,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  double dVar5;
  size_type sVar6;
  double dx;
  size_type i;
  double x_local;
  Curve *this_local;
  
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,0);
  if (*pvVar4 < x) {
    for (dx = 4.94065645841247e-324;
        dVar5 = (double)std::vector<double,_std::allocator<double>_>::size(&this->xData),
        (ulong)dx < (ulong)dVar5; dx = (double)((long)dx + 1)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(size_type)dx);
      if (x <= *pvVar4) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->xData,(size_type)dx);
        dVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)dx - 1)
        ;
        dVar5 = dVar5 - *pvVar4;
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->yData,(long)dx - 1);
          return *pvVar4;
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(long)dx - 1)
        ;
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)dx - 1)
        ;
        dVar2 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->yData,(size_type)dx);
        dVar3 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(long)dx - 1)
        ;
        return ((x - dVar2) / dVar5) * (dVar3 - *pvVar4) + dVar1;
      }
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&this->xData);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,sVar6 - 1);
    this_local = (Curve *)*pvVar4;
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,0);
    this_local = (Curve *)*pvVar4;
  }
  return (double)this_local;
}

Assistant:

double Curve::getYofX(double x)
{
    if ( x <= xData[0] ) return yData[0];

    for (vector<double>::size_type i = 1; i < xData.size(); i++)
    {
        if ( x <= xData[i] )
        {
            double dx = xData[i] - xData[i-1];
            if ( dx == 0.0 ) return yData[i-1];
            return yData[i-1] + (x - xData[i-1]) / dx * (yData[i] - yData[i-1]);
        }
    }
    return yData[xData.size()-1];
}